

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O2

void __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
::clear(BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  CLI::std::mutex::lock(&this->m_pullLock);
  CLI::std::mutex::lock(&this->m_pushLock);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
             &this->pullElements);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
             &this->pushElements);
  while ((this->priorityQueue).c.
         super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         (this->priorityQueue).c.
         super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_front
              (&(this->priorityQueue).c);
  }
  LOCK();
  (this->queueEmptyFlag)._M_base._M_i = true;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)this);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_pullLock);
  return;
}

Assistant:

void clear()
        {
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
            pullElements.clear();
            pushElements.clear();
            while (!priorityQueue.empty()) {
                priorityQueue.pop();
            }
            queueEmptyFlag = true;
        }